

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFScanningDecoder.cpp
# Opt level: O3

DecoderResult *
ZXing::Pdf417::DecodeCodewords
          (DecoderResult *__return_storage_ptr__,vector<int,_std::allocator<int>_> *codewords,
          int numECCodeWords)

{
  uint *puVar1;
  int *cw;
  uint *puVar2;
  undefined4 in_register_00000014;
  uint uVar3;
  int *piVar4;
  
  puVar1 = (uint *)(codewords->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
  for (puVar2 = (uint *)(codewords->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    if ((int)*puVar2 < 0) {
      uVar3 = 0;
    }
    else {
      piVar4 = (int *)puVar2;
      if (0x3a0 < *puVar2) {
        piVar4 = &CodewordDecoder::MAX_CODEWORDS_IN_BARCODE;
      }
      uVar3 = *piVar4;
    }
    *puVar2 = uVar3;
  }
  DecodeCodewords(__return_storage_ptr__,(Pdf417 *)codewords,
                  (vector<int,_std::allocator<int>_> *)CONCAT44(in_register_00000014,numECCodeWords)
                  ,0,(vector<int,_std::allocator<int>_> *)0x0);
  return __return_storage_ptr__;
}

Assistant:

DecoderResult DecodeCodewords(std::vector<int>& codewords, int numECCodeWords)
{
	for (auto& cw : codewords)
		cw = std::clamp(cw, 0, CodewordDecoder::MAX_CODEWORDS_IN_BARCODE);

	// erasures array has never been actually used inside the error correction code
	return DecodeCodewords(codewords, numECCodeWords, {});
}